

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O2

size_t fiobj_str_concat(FIOBJ dest,FIOBJ obj)

{
  fiobj_object_vtable_s *pfVar1;
  uint uVar2;
  ulong uVar3;
  char cVar4;
  fio_str_info_s o;
  fio_str_info_s local_48;
  fio_str_info_s local_28;
  
  if (((uint)dest & 7) != 2) {
    __assert_fail("FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_str.c"
                  ,0x137,"size_t fiobj_str_concat(FIOBJ, FIOBJ)");
  }
  uVar3 = dest & 0xfffffffffffffff8;
  if (*(char *)(uVar3 + 0x11) != '\0') {
    return 0;
  }
  *(undefined8 *)(uVar3 + 8) = 0;
  if (obj == 0) {
LAB_0013cf7e:
    local_48.data = "null";
    local_48.len._0_4_ = 4;
    goto LAB_0013cf91;
  }
  cVar4 = (char)obj;
  if ((obj & 1) != 0) {
    fio_ltocstr(&local_48,(long)obj >> 1);
    goto LAB_0013cf95;
  }
  switch((uint)obj & 6) {
  case 0:
    cVar4 = *(char *)(obj & 0xfffffffffffffff8);
LAB_0013cf1b:
    switch(cVar4) {
    case '\'':
      pfVar1 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      goto switchD_0013cf10_caseD_2;
    case ')':
      pfVar1 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      goto switchD_0013cf10_caseD_4;
    case '+':
      pfVar1 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar1 = &FIOBJECT_VTABLE_NUMBER;
    }
    break;
  case 2:
switchD_0013cf10_caseD_2:
    pfVar1 = &FIOBJECT_VTABLE_STRING;
    break;
  case 4:
switchD_0013cf10_caseD_4:
    pfVar1 = &FIOBJECT_VTABLE_HASH;
    break;
  case 6:
    if (cVar4 == '&') {
      local_48.data = "false";
      local_48.len._0_4_ = 5;
    }
    else {
      uVar2 = (uint)obj & 0xff;
      if (uVar2 != 0x16) {
        if (uVar2 == 6) goto LAB_0013cf7e;
        goto LAB_0013cf1b;
      }
      local_48.data = "true";
      local_48.len._0_4_ = 4;
    }
LAB_0013cf91:
    local_48.capa._0_4_ = 0;
    local_48.capa._4_4_ = 0;
    local_48.len._4_4_ = 0;
    goto LAB_0013cf95;
  }
  (*pfVar1->to_str)(&local_48,obj);
LAB_0013cf95:
  if (CONCAT44(local_48.len._4_4_,(undefined4)local_48.len) == 0) {
    local_28.len = fio_str_len((fio_str_s_conflict *)(uVar3 + 0x10));
  }
  else {
    fio_str_write(&local_28,(fio_str_s_conflict *)(uVar3 + 0x10),local_48.data,
                  CONCAT44(local_48.len._4_4_,(undefined4)local_48.len));
  }
  return local_28.len;
}

Assistant:

size_t fiobj_str_concat(FIOBJ dest, FIOBJ obj) {
  assert(FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING));
  if (obj2str(dest)->str.frozen)
    return 0;
  obj2str(dest)->hash = 0;
  fio_str_info_s o = fiobj_obj2cstr(obj);
  if (o.len == 0)
    return fio_str_len(&obj2str(dest)->str);
  return fio_str_write(&obj2str(dest)->str, o.data, o.len).len;
}